

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,char *name)

{
  int *piVar1;
  ImU32 IVar2;
  int iVar3;
  ImGuiID IVar4;
  size_t sVar5;
  char *__dest;
  uint *__dest_00;
  ImGuiContext *pIVar6;
  ImDrawList *this_00;
  int iVar7;
  int iVar8;
  uint *puVar9;
  
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->PosFloat).x = 0.0;
  (this->PosFloat).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->ContentsRegionRect).Min.x = 3.4028235e+38;
  (this->ContentsRegionRect).Min.y = 3.4028235e+38;
  (this->ContentsRegionRect).Max.x = -3.4028235e+38;
  (this->ContentsRegionRect).Max.y = -3.4028235e+38;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->DC).ChildWindows.Size = 0;
  (this->DC).ChildWindows.Capacity = 0;
  (this->DC).ChildWindows.Data = (ImGuiWindow **)0x0;
  (this->DC).ColumnsData.Size = 0;
  (this->DC).ColumnsData.Capacity = 0;
  (this->DC).ColumnsData.Data = (ImGuiColumnData *)0x0;
  (this->DC).CursorPos.x = 0.0;
  (this->DC).CursorPos.y = 0.0;
  (this->DC).CursorPosPrevLine.x = 0.0;
  (this->DC).CursorPosPrevLine.y = 0.0;
  (this->DC).CursorStartPos.x = 0.0;
  (this->DC).CursorStartPos.y = 0.0;
  (this->DC).CursorMaxPos.x = 0.0;
  (this->DC).CursorMaxPos.y = 0.0;
  (this->DC).CurrentLineHeight = 0.0;
  (this->DC).CurrentLineTextBaseOffset = 0.0;
  (this->DC).PrevLineHeight = 0.0;
  (this->DC).PrevLineTextBaseOffset = 0.0;
  (this->DC).ItemFlagsStack.Size = 0;
  (this->DC).ItemFlagsStack.Capacity = 0;
  (this->DC).ItemFlagsStack.Data = (int *)0x0;
  (this->DC).ItemWidthStack.Size = 0;
  (this->DC).ItemWidthStack.Capacity = 0;
  (this->DC).ItemWidthStack.Data = (float *)0x0;
  (this->DC).TextWrapPosStack.Size = 0;
  (this->DC).TextWrapPosStack.Capacity = 0;
  (this->DC).TextWrapPosStack.Data = (float *)0x0;
  (this->DC).GroupStack.Size = 0;
  (this->DC).GroupStack.Capacity = 0;
  (this->DC).GroupStack.Data = (ImGuiGroupData *)0x0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->DC).LogLinePosY = -1.0;
  (this->DC).MenuBarOffsetX = 0.0;
  (this->DC).StateStorage = (ImGuiStorage *)0x0;
  (this->DC).LayoutType = 0;
  (this->DC).ItemFlags = 1;
  (this->DC).TreeDepth = 0;
  (this->DC).LastItemId = 0;
  (this->DC).LastItemRect.Min.x = 0.0;
  (this->DC).LastItemRect.Min.y = 0.0;
  *(undefined8 *)((long)&(this->DC).LastItemRect.Min.x + 3) = 0;
  *(undefined8 *)((long)&(this->DC).LastItemRect.Max.x + 3) = 0;
  (this->DC).ItemWidth = 0.0;
  (this->DC).TextWrapPos = -1.0;
  (this->DC).StackSizesBackup[0] = 0;
  (this->DC).StackSizesBackup[1] = 0;
  (this->DC).StackSizesBackup[2] = 0;
  (this->DC).StackSizesBackup[3] = 0;
  (this->DC).StackSizesBackup[4] = 0;
  (this->DC).StackSizesBackup[5] = 0;
  (this->DC).IndentX = 0.0;
  (this->DC).GroupOffsetX = 0.0;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).ColumnsCurrent = 0;
  (this->DC).ColumnsCount = 1;
  (this->DC).ColumnsMinX = 0.0;
  (this->DC).ColumnsMaxX = 0.0;
  (this->DC).ColumnsStartPosY = 0.0;
  (this->DC).ColumnsStartMaxPosX = 0.0;
  (this->DC).ColumnsCellMinY = 0.0;
  (this->DC).ColumnsCellMaxY = 0.0;
  (this->DC).ColumnsFlags = 0;
  (this->DC).ColumnsSetId = 0;
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  (this->ClipRect).Min.x = 3.4028235e+38;
  (this->ClipRect).Min.y = 3.4028235e+38;
  (this->ClipRect).Max.x = -3.4028235e+38;
  (this->ClipRect).Max.y = -3.4028235e+38;
  (this->WindowRectClipped).Min.x = 3.4028235e+38;
  (this->WindowRectClipped).Min.y = 3.4028235e+38;
  (this->WindowRectClipped).Max.x = -3.4028235e+38;
  (this->WindowRectClipped).Max.y = -3.4028235e+38;
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (Pair *)0x0;
  (this->MenuColumns).NextWidths[4] = 0.0;
  (this->MenuColumns).NextWidths[5] = 0.0;
  (this->MenuColumns).NextWidths[6] = 0.0;
  (this->MenuColumns).NextWidths[7] = 0.0;
  (this->MenuColumns).NextWidths[0] = 0.0;
  (this->MenuColumns).NextWidths[1] = 0.0;
  (this->MenuColumns).NextWidths[2] = 0.0;
  (this->MenuColumns).NextWidths[3] = 0.0;
  (this->MenuColumns).Pos[4] = 0.0;
  (this->MenuColumns).Pos[5] = 0.0;
  (this->MenuColumns).Pos[6] = 0.0;
  (this->MenuColumns).Pos[7] = 0.0;
  (this->MenuColumns).Pos[0] = 0.0;
  (this->MenuColumns).Pos[1] = 0.0;
  (this->MenuColumns).Pos[2] = 0.0;
  (this->MenuColumns).Pos[3] = 0.0;
  (this->MenuColumns).Count = 0;
  (this->MenuColumns).Spacing = 0.0;
  (this->MenuColumns).Width = 0.0;
  (this->MenuColumns).NextWidth = 0.0;
  sVar5 = strlen(name);
  pIVar6 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (char *)(*(pIVar6->IO).MemAllocFn)(sVar5 + 1);
  memcpy(__dest,name,sVar5 + 1);
  this->Name = __dest;
  IVar2 = ImHash(name,0,0);
  this->ID = IVar2;
  pIVar6 = GImGui;
  iVar7 = (this->IDStack).Size;
  if (iVar7 != (this->IDStack).Capacity) {
    __dest_00 = (this->IDStack).Data;
    goto LAB_00159730;
  }
  if (iVar7 == 0) {
    iVar3 = 8;
  }
  else {
    iVar3 = iVar7 / 2 + iVar7;
  }
  iVar8 = iVar7 + 1;
  if (iVar7 + 1 < iVar3) {
    iVar8 = iVar3;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (uint *)(*(pIVar6->IO).MemAllocFn)((long)iVar8 << 2);
  puVar9 = (this->IDStack).Data;
  if (puVar9 == (uint *)0x0) {
LAB_00159712:
    puVar9 = (uint *)0x0;
    pIVar6 = GImGui;
  }
  else {
    memcpy(__dest_00,puVar9,(long)(this->IDStack).Size << 2);
    pIVar6 = GImGui;
    puVar9 = (this->IDStack).Data;
    if (puVar9 == (uint *)0x0) goto LAB_00159712;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar6->IO).MemFreeFn)(puVar9);
  (this->IDStack).Data = __dest_00;
  (this->IDStack).Capacity = iVar8;
  IVar2 = this->ID;
  iVar7 = (this->IDStack).Size;
LAB_00159730:
  (this->IDStack).Size = iVar7 + 1;
  __dest_00[iVar7] = IVar2;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  this->Flags = 0;
  this->OrderWithinParent = 0;
  (this->PosFloat).x = 0.0;
  (this->PosFloat).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  IVar4 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar4;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->ScrollbarX = false;
  this->ScrollbarY = false;
  this->SkipItems = false;
  this->Appearing = false;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  this->BorderSize = 0.0;
  this->Active = false;
  this->WasActive = false;
  this->Accessed = false;
  this->Collapsed = false;
  this->BeginCount = 0;
  this->PopupId = 0;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoFitOnlyGrows = false;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowCollapsedAllowFlags = 0xf;
  this->AutoFitChildAxises = 0;
  this->AutoPosLastDirection = -1;
  this->HiddenFrames = 0;
  this->SetWindowPosAllowFlags = 0xf;
  this->SetWindowPosCenterWanted = false;
  this->LastFrameActive = -1;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  pIVar6 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  this_00 = (ImDrawList *)(*(pIVar6->IO).MemAllocFn)(0x98);
  this->DrawList = this_00;
  ImDrawList::ImDrawList(this_00);
  this->DrawList->_OwnerName = this->Name;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootNonPopupWindow = (ImGuiWindow *)0x0;
  this->FocusIdxAllCounter = -1;
  this->FocusIdxTabCounter = -1;
  this->FocusIdxAllRequestCurrent = 0x7fffffff;
  this->FocusIdxTabRequestCurrent = 0x7fffffff;
  this->FocusIdxAllRequestNext = 0x7fffffff;
  this->FocusIdxTabRequestNext = 0x7fffffff;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(const char* name)
{
    Name = ImStrdup(name);
    ID = ImHash(name, 0);
    IDStack.push_back(ID);
    Flags = 0;
    OrderWithinParent = 0;
    PosFloat = Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    SizeContents = SizeContentsExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    MoveId = GetID("#MOVE");
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarX = ScrollbarY = false;
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    BorderSize = 0.0f;
    Active = WasActive = false;
    Accessed = false;
    Collapsed = false;
    SkipItems = false;
    Appearing = false;
    BeginCount = 0;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitOnlyGrows = false;
    AutoFitChildAxises = 0x00;
    AutoPosLastDirection = -1;
    HiddenFrames = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosCenterWanted = false;

    LastFrameActive = -1;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;

    DrawList = (ImDrawList*)ImGui::MemAlloc(sizeof(ImDrawList));
    IM_PLACEMENT_NEW(DrawList) ImDrawList();
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootNonPopupWindow = NULL;

    FocusIdxAllCounter = FocusIdxTabCounter = -1;
    FocusIdxAllRequestCurrent = FocusIdxTabRequestCurrent = INT_MAX;
    FocusIdxAllRequestNext = FocusIdxTabRequestNext = INT_MAX;
}